

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

_Bool translateRMRegister(MCInst *mcInst,InternalInstruction *insn)

{
  InternalInstruction *insn_local;
  MCInst *mcInst_local;
  
  if ((insn->eaBase != EA_BASE_sib) && (insn->eaBase != EA_BASE_sib64)) {
    switch(insn->eaBase) {
    case EA_BASE_NONE:
      return true;
    case EA_BASE_BX_SI:
    case EA_BASE_BX_DI:
    case EA_BASE_BP_SI:
    case EA_BASE_BP_DI:
    case EA_BASE_SI:
    case EA_BASE_DI:
    case EA_BASE_BP:
    case EA_BASE_BX:
    case EA_BASE_R8W:
    case EA_BASE_R9W:
    case EA_BASE_R10W:
    case EA_BASE_R11W:
    case EA_BASE_R12W:
    case EA_BASE_R13W:
    case EA_BASE_R14W:
    case EA_BASE_R15W:
    case EA_BASE_EAX:
    case EA_BASE_ECX:
    case EA_BASE_EDX:
    case EA_BASE_EBX:
    case EA_BASE_sib:
    case EA_BASE_EBP:
    case EA_BASE_ESI:
    case EA_BASE_EDI:
    case EA_BASE_R8D:
    case EA_BASE_R9D:
    case EA_BASE_R10D:
    case EA_BASE_R11D:
    case EA_BASE_R12D:
    case EA_BASE_R13D:
    case EA_BASE_R14D:
    case EA_BASE_R15D:
    case EA_BASE_RAX:
    case EA_BASE_RCX:
    case EA_BASE_RDX:
    case EA_BASE_RBX:
    case EA_BASE_sib64:
    case EA_BASE_RBP:
    case EA_BASE_RSI:
    case EA_BASE_RDI:
    case EA_BASE_R8:
    case EA_BASE_R9:
    case EA_BASE_R10:
    case EA_BASE_R11:
    case EA_BASE_R12:
    case EA_BASE_R13:
    case EA_BASE_R14:
    case EA_BASE_R15:
      return true;
    case EA_REG_AL:
      MCOperand_CreateReg0(mcInst,2);
      break;
    case EA_REG_CL:
      MCOperand_CreateReg0(mcInst,10);
      break;
    case EA_REG_DL:
      MCOperand_CreateReg0(mcInst,0x10);
      break;
    case EA_REG_BL:
      MCOperand_CreateReg0(mcInst,5);
      break;
    case EA_REG_AH:
      MCOperand_CreateReg0(mcInst,1);
      break;
    case EA_REG_CH:
      MCOperand_CreateReg0(mcInst,9);
      break;
    case EA_REG_DH:
      MCOperand_CreateReg0(mcInst,0xd);
      break;
    case EA_REG_BH:
      MCOperand_CreateReg0(mcInst,4);
      break;
    case EA_REG_R8B:
      MCOperand_CreateReg0(mcInst,0xd2);
      break;
    case EA_REG_R9B:
      MCOperand_CreateReg0(mcInst,0xd3);
      break;
    case EA_REG_R10B:
      MCOperand_CreateReg0(mcInst,0xd4);
      break;
    case EA_REG_R11B:
      MCOperand_CreateReg0(mcInst,0xd5);
      break;
    case EA_REG_R12B:
      MCOperand_CreateReg0(mcInst,0xd6);
      break;
    case EA_REG_R13B:
      MCOperand_CreateReg0(mcInst,0xd7);
      break;
    case EA_REG_R14B:
      MCOperand_CreateReg0(mcInst,0xd8);
      break;
    case EA_REG_R15B:
      MCOperand_CreateReg0(mcInst,0xd9);
      break;
    case EA_REG_SPL:
      MCOperand_CreateReg0(mcInst,0x30);
      break;
    case EA_REG_BPL:
      MCOperand_CreateReg0(mcInst,7);
      break;
    case EA_REG_SIL:
      MCOperand_CreateReg0(mcInst,0x2e);
      break;
    case EA_REG_DIL:
      MCOperand_CreateReg0(mcInst,0xf);
      break;
    case EA_REG_AX:
      MCOperand_CreateReg0(mcInst,3);
      break;
    case EA_REG_CX:
      MCOperand_CreateReg0(mcInst,0xc);
      break;
    case EA_REG_DX:
      MCOperand_CreateReg0(mcInst,0x12);
      break;
    case EA_REG_BX:
      MCOperand_CreateReg0(mcInst,8);
      break;
    case EA_REG_SP:
      MCOperand_CreateReg0(mcInst,0x2f);
      break;
    case EA_REG_BP:
      MCOperand_CreateReg0(mcInst,6);
      break;
    case EA_REG_SI:
      MCOperand_CreateReg0(mcInst,0x2d);
      break;
    case EA_REG_DI:
      MCOperand_CreateReg0(mcInst,0xe);
      break;
    case EA_REG_R8W:
      MCOperand_CreateReg0(mcInst,0xe2);
      break;
    case EA_REG_R9W:
      MCOperand_CreateReg0(mcInst,0xe3);
      break;
    case EA_REG_R10W:
      MCOperand_CreateReg0(mcInst,0xe4);
      break;
    case EA_REG_R11W:
      MCOperand_CreateReg0(mcInst,0xe5);
      break;
    case EA_REG_R12W:
      MCOperand_CreateReg0(mcInst,0xe6);
      break;
    case EA_REG_R13W:
      MCOperand_CreateReg0(mcInst,0xe7);
      break;
    case EA_REG_R14W:
      MCOperand_CreateReg0(mcInst,0xe8);
      break;
    case EA_REG_R15W:
      MCOperand_CreateReg0(mcInst,0xe9);
      break;
    case EA_REG_EAX:
      MCOperand_CreateReg0(mcInst,0x13);
      break;
    case EA_REG_ECX:
      MCOperand_CreateReg0(mcInst,0x16);
      break;
    case EA_REG_EDX:
      MCOperand_CreateReg0(mcInst,0x18);
      break;
    case EA_REG_EBX:
      MCOperand_CreateReg0(mcInst,0x15);
      break;
    case EA_REG_ESP:
      MCOperand_CreateReg0(mcInst,0x1e);
      break;
    case EA_REG_EBP:
      MCOperand_CreateReg0(mcInst,0x14);
      break;
    case EA_REG_ESI:
      MCOperand_CreateReg0(mcInst,0x1d);
      break;
    case EA_REG_EDI:
      MCOperand_CreateReg0(mcInst,0x17);
      break;
    case EA_REG_R8D:
      MCOperand_CreateReg0(mcInst,0xda);
      break;
    case EA_REG_R9D:
      MCOperand_CreateReg0(mcInst,0xdb);
      break;
    case EA_REG_R10D:
      MCOperand_CreateReg0(mcInst,0xdc);
      break;
    case EA_REG_R11D:
      MCOperand_CreateReg0(mcInst,0xdd);
      break;
    case EA_REG_R12D:
      MCOperand_CreateReg0(mcInst,0xde);
      break;
    case EA_REG_R13D:
      MCOperand_CreateReg0(mcInst,0xdf);
      break;
    case EA_REG_R14D:
      MCOperand_CreateReg0(mcInst,0xe0);
      break;
    case EA_REG_R15D:
      MCOperand_CreateReg0(mcInst,0xe1);
      break;
    case EA_REG_RAX:
      MCOperand_CreateReg0(mcInst,0x23);
      break;
    case EA_REG_RCX:
      MCOperand_CreateReg0(mcInst,0x26);
      break;
    case EA_REG_RDX:
      MCOperand_CreateReg0(mcInst,0x28);
      break;
    case EA_REG_RBX:
      MCOperand_CreateReg0(mcInst,0x25);
      break;
    case EA_REG_RSP:
      MCOperand_CreateReg0(mcInst,0x2c);
      break;
    case EA_REG_RBP:
      MCOperand_CreateReg0(mcInst,0x24);
      break;
    case EA_REG_RSI:
      MCOperand_CreateReg0(mcInst,0x2b);
      break;
    case EA_REG_RDI:
      MCOperand_CreateReg0(mcInst,0x27);
      break;
    case EA_REG_R8:
      MCOperand_CreateReg0(mcInst,0x62);
      break;
    case EA_REG_R9:
      MCOperand_CreateReg0(mcInst,99);
      break;
    case EA_REG_R10:
      MCOperand_CreateReg0(mcInst,100);
      break;
    case EA_REG_R11:
      MCOperand_CreateReg0(mcInst,0x65);
      break;
    case EA_REG_R12:
      MCOperand_CreateReg0(mcInst,0x66);
      break;
    case EA_REG_R13:
      MCOperand_CreateReg0(mcInst,0x67);
      break;
    case EA_REG_R14:
      MCOperand_CreateReg0(mcInst,0x68);
      break;
    case EA_REG_R15:
      MCOperand_CreateReg0(mcInst,0x69);
      break;
    case EA_REG_MM0:
      MCOperand_CreateReg0(mcInst,0x5a);
      break;
    case EA_REG_MM1:
      MCOperand_CreateReg0(mcInst,0x5b);
      break;
    case EA_REG_MM2:
      MCOperand_CreateReg0(mcInst,0x5c);
      break;
    case EA_REG_MM3:
      MCOperand_CreateReg0(mcInst,0x5d);
      break;
    case EA_REG_MM4:
      MCOperand_CreateReg0(mcInst,0x5e);
      break;
    case EA_REG_MM5:
      MCOperand_CreateReg0(mcInst,0x5f);
      break;
    case EA_REG_MM6:
      MCOperand_CreateReg0(mcInst,0x60);
      break;
    case EA_REG_MM7:
      MCOperand_CreateReg0(mcInst,0x61);
      break;
    case EA_REG_XMM0:
      MCOperand_CreateReg0(mcInst,0x72);
      break;
    case EA_REG_XMM1:
      MCOperand_CreateReg0(mcInst,0x73);
      break;
    case EA_REG_XMM2:
      MCOperand_CreateReg0(mcInst,0x74);
      break;
    case EA_REG_XMM3:
      MCOperand_CreateReg0(mcInst,0x75);
      break;
    case EA_REG_XMM4:
      MCOperand_CreateReg0(mcInst,0x76);
      break;
    case EA_REG_XMM5:
      MCOperand_CreateReg0(mcInst,0x77);
      break;
    case EA_REG_XMM6:
      MCOperand_CreateReg0(mcInst,0x78);
      break;
    case EA_REG_XMM7:
      MCOperand_CreateReg0(mcInst,0x79);
      break;
    case EA_REG_XMM8:
      MCOperand_CreateReg0(mcInst,0x7a);
      break;
    case EA_REG_XMM9:
      MCOperand_CreateReg0(mcInst,0x7b);
      break;
    case EA_REG_XMM10:
      MCOperand_CreateReg0(mcInst,0x7c);
      break;
    case EA_REG_XMM11:
      MCOperand_CreateReg0(mcInst,0x7d);
      break;
    case EA_REG_XMM12:
      MCOperand_CreateReg0(mcInst,0x7e);
      break;
    case EA_REG_XMM13:
      MCOperand_CreateReg0(mcInst,0x7f);
      break;
    case EA_REG_XMM14:
      MCOperand_CreateReg0(mcInst,0x80);
      break;
    case EA_REG_XMM15:
      MCOperand_CreateReg0(mcInst,0x81);
      break;
    case EA_REG_XMM16:
      MCOperand_CreateReg0(mcInst,0x82);
      break;
    case EA_REG_XMM17:
      MCOperand_CreateReg0(mcInst,0x83);
      break;
    case EA_REG_XMM18:
      MCOperand_CreateReg0(mcInst,0x84);
      break;
    case EA_REG_XMM19:
      MCOperand_CreateReg0(mcInst,0x85);
      break;
    case EA_REG_XMM20:
      MCOperand_CreateReg0(mcInst,0x86);
      break;
    case EA_REG_XMM21:
      MCOperand_CreateReg0(mcInst,0x87);
      break;
    case EA_REG_XMM22:
      MCOperand_CreateReg0(mcInst,0x88);
      break;
    case EA_REG_XMM23:
      MCOperand_CreateReg0(mcInst,0x89);
      break;
    case EA_REG_XMM24:
      MCOperand_CreateReg0(mcInst,0x8a);
      break;
    case EA_REG_XMM25:
      MCOperand_CreateReg0(mcInst,0x8b);
      break;
    case EA_REG_XMM26:
      MCOperand_CreateReg0(mcInst,0x8c);
      break;
    case EA_REG_XMM27:
      MCOperand_CreateReg0(mcInst,0x8d);
      break;
    case EA_REG_XMM28:
      MCOperand_CreateReg0(mcInst,0x8e);
      break;
    case EA_REG_XMM29:
      MCOperand_CreateReg0(mcInst,0x8f);
      break;
    case EA_REG_XMM30:
      MCOperand_CreateReg0(mcInst,0x90);
      break;
    case EA_REG_XMM31:
      MCOperand_CreateReg0(mcInst,0x91);
      break;
    case EA_REG_YMM0:
      MCOperand_CreateReg0(mcInst,0x92);
      break;
    case EA_REG_YMM1:
      MCOperand_CreateReg0(mcInst,0x93);
      break;
    case EA_REG_YMM2:
      MCOperand_CreateReg0(mcInst,0x94);
      break;
    case EA_REG_YMM3:
      MCOperand_CreateReg0(mcInst,0x95);
      break;
    case EA_REG_YMM4:
      MCOperand_CreateReg0(mcInst,0x96);
      break;
    case EA_REG_YMM5:
      MCOperand_CreateReg0(mcInst,0x97);
      break;
    case EA_REG_YMM6:
      MCOperand_CreateReg0(mcInst,0x98);
      break;
    case EA_REG_YMM7:
      MCOperand_CreateReg0(mcInst,0x99);
      break;
    case EA_REG_YMM8:
      MCOperand_CreateReg0(mcInst,0x9a);
      break;
    case EA_REG_YMM9:
      MCOperand_CreateReg0(mcInst,0x9b);
      break;
    case EA_REG_YMM10:
      MCOperand_CreateReg0(mcInst,0x9c);
      break;
    case EA_REG_YMM11:
      MCOperand_CreateReg0(mcInst,0x9d);
      break;
    case EA_REG_YMM12:
      MCOperand_CreateReg0(mcInst,0x9e);
      break;
    case EA_REG_YMM13:
      MCOperand_CreateReg0(mcInst,0x9f);
      break;
    case EA_REG_YMM14:
      MCOperand_CreateReg0(mcInst,0xa0);
      break;
    case EA_REG_YMM15:
      MCOperand_CreateReg0(mcInst,0xa1);
      break;
    case EA_REG_YMM16:
      MCOperand_CreateReg0(mcInst,0xa2);
      break;
    case EA_REG_YMM17:
      MCOperand_CreateReg0(mcInst,0xa3);
      break;
    case EA_REG_YMM18:
      MCOperand_CreateReg0(mcInst,0xa4);
      break;
    case EA_REG_YMM19:
      MCOperand_CreateReg0(mcInst,0xa5);
      break;
    case EA_REG_YMM20:
      MCOperand_CreateReg0(mcInst,0xa6);
      break;
    case EA_REG_YMM21:
      MCOperand_CreateReg0(mcInst,0xa7);
      break;
    case EA_REG_YMM22:
      MCOperand_CreateReg0(mcInst,0xa8);
      break;
    case EA_REG_YMM23:
      MCOperand_CreateReg0(mcInst,0xa9);
      break;
    case EA_REG_YMM24:
      MCOperand_CreateReg0(mcInst,0xaa);
      break;
    case EA_REG_YMM25:
      MCOperand_CreateReg0(mcInst,0xab);
      break;
    case EA_REG_YMM26:
      MCOperand_CreateReg0(mcInst,0xac);
      break;
    case EA_REG_YMM27:
      MCOperand_CreateReg0(mcInst,0xad);
      break;
    case EA_REG_YMM28:
      MCOperand_CreateReg0(mcInst,0xae);
      break;
    case EA_REG_YMM29:
      MCOperand_CreateReg0(mcInst,0xaf);
      break;
    case EA_REG_YMM30:
      MCOperand_CreateReg0(mcInst,0xb0);
      break;
    case EA_REG_YMM31:
      MCOperand_CreateReg0(mcInst,0xb1);
      break;
    case EA_REG_ZMM0:
      MCOperand_CreateReg0(mcInst,0xb2);
      break;
    case EA_REG_ZMM1:
      MCOperand_CreateReg0(mcInst,0xb3);
      break;
    case EA_REG_ZMM2:
      MCOperand_CreateReg0(mcInst,0xb4);
      break;
    case EA_REG_ZMM3:
      MCOperand_CreateReg0(mcInst,0xb5);
      break;
    case EA_REG_ZMM4:
      MCOperand_CreateReg0(mcInst,0xb6);
      break;
    case EA_REG_ZMM5:
      MCOperand_CreateReg0(mcInst,0xb7);
      break;
    case EA_REG_ZMM6:
      MCOperand_CreateReg0(mcInst,0xb8);
      break;
    case EA_REG_ZMM7:
      MCOperand_CreateReg0(mcInst,0xb9);
      break;
    case EA_REG_ZMM8:
      MCOperand_CreateReg0(mcInst,0xba);
      break;
    case EA_REG_ZMM9:
      MCOperand_CreateReg0(mcInst,0xbb);
      break;
    case EA_REG_ZMM10:
      MCOperand_CreateReg0(mcInst,0xbc);
      break;
    case EA_REG_ZMM11:
      MCOperand_CreateReg0(mcInst,0xbd);
      break;
    case EA_REG_ZMM12:
      MCOperand_CreateReg0(mcInst,0xbe);
      break;
    case EA_REG_ZMM13:
      MCOperand_CreateReg0(mcInst,0xbf);
      break;
    case EA_REG_ZMM14:
      MCOperand_CreateReg0(mcInst,0xc0);
      break;
    case EA_REG_ZMM15:
      MCOperand_CreateReg0(mcInst,0xc1);
      break;
    case EA_REG_ZMM16:
      MCOperand_CreateReg0(mcInst,0xc2);
      break;
    case EA_REG_ZMM17:
      MCOperand_CreateReg0(mcInst,0xc3);
      break;
    case EA_REG_ZMM18:
      MCOperand_CreateReg0(mcInst,0xc4);
      break;
    case EA_REG_ZMM19:
      MCOperand_CreateReg0(mcInst,0xc5);
      break;
    case EA_REG_ZMM20:
      MCOperand_CreateReg0(mcInst,0xc6);
      break;
    case EA_REG_ZMM21:
      MCOperand_CreateReg0(mcInst,199);
      break;
    case EA_REG_ZMM22:
      MCOperand_CreateReg0(mcInst,200);
      break;
    case EA_REG_ZMM23:
      MCOperand_CreateReg0(mcInst,0xc9);
      break;
    case EA_REG_ZMM24:
      MCOperand_CreateReg0(mcInst,0xca);
      break;
    case EA_REG_ZMM25:
      MCOperand_CreateReg0(mcInst,0xcb);
      break;
    case EA_REG_ZMM26:
      MCOperand_CreateReg0(mcInst,0xcc);
      break;
    case EA_REG_ZMM27:
      MCOperand_CreateReg0(mcInst,0xcd);
      break;
    case EA_REG_ZMM28:
      MCOperand_CreateReg0(mcInst,0xce);
      break;
    case EA_REG_ZMM29:
      MCOperand_CreateReg0(mcInst,0xcf);
      break;
    case EA_REG_ZMM30:
      MCOperand_CreateReg0(mcInst,0xd0);
      break;
    case EA_REG_ZMM31:
      MCOperand_CreateReg0(mcInst,0xd1);
      break;
    case EA_REG_K0:
      MCOperand_CreateReg0(mcInst,0x52);
      break;
    case EA_REG_K1:
      MCOperand_CreateReg0(mcInst,0x53);
      break;
    case EA_REG_K2:
      MCOperand_CreateReg0(mcInst,0x54);
      break;
    case EA_REG_K3:
      MCOperand_CreateReg0(mcInst,0x55);
      break;
    case EA_REG_K4:
      MCOperand_CreateReg0(mcInst,0x56);
      break;
    case EA_REG_K5:
      MCOperand_CreateReg0(mcInst,0x57);
      break;
    case EA_REG_K6:
      MCOperand_CreateReg0(mcInst,0x58);
      break;
    case EA_REG_K7:
      MCOperand_CreateReg0(mcInst,0x59);
      break;
    case EA_REG_ES:
      MCOperand_CreateReg0(mcInst,0x1c);
      break;
    case EA_REG_CS:
      MCOperand_CreateReg0(mcInst,0xb);
      break;
    case EA_REG_SS:
      MCOperand_CreateReg0(mcInst,0x31);
      break;
    case EA_REG_DS:
      MCOperand_CreateReg0(mcInst,0x11);
      break;
    case EA_REG_FS:
      MCOperand_CreateReg0(mcInst,0x20);
      break;
    case EA_REG_GS:
      MCOperand_CreateReg0(mcInst,0x21);
      break;
    case EA_REG_DR0:
      MCOperand_CreateReg0(mcInst,0x42);
      break;
    case EA_REG_DR1:
      MCOperand_CreateReg0(mcInst,0x43);
      break;
    case EA_REG_DR2:
      MCOperand_CreateReg0(mcInst,0x44);
      break;
    case EA_REG_DR3:
      MCOperand_CreateReg0(mcInst,0x45);
      break;
    case EA_REG_DR4:
      MCOperand_CreateReg0(mcInst,0x46);
      break;
    case EA_REG_DR5:
      MCOperand_CreateReg0(mcInst,0x47);
      break;
    case EA_REG_DR6:
      MCOperand_CreateReg0(mcInst,0x48);
      break;
    case EA_REG_DR7:
      MCOperand_CreateReg0(mcInst,0x49);
      break;
    case EA_REG_CR0:
      MCOperand_CreateReg0(mcInst,0x32);
      break;
    case EA_REG_CR1:
      MCOperand_CreateReg0(mcInst,0x33);
      break;
    case EA_REG_CR2:
      MCOperand_CreateReg0(mcInst,0x34);
      break;
    case EA_REG_CR3:
      MCOperand_CreateReg0(mcInst,0x35);
      break;
    case EA_REG_CR4:
      MCOperand_CreateReg0(mcInst,0x36);
      break;
    case EA_REG_CR5:
      MCOperand_CreateReg0(mcInst,0x37);
      break;
    case EA_REG_CR6:
      MCOperand_CreateReg0(mcInst,0x38);
      break;
    case EA_REG_CR7:
      MCOperand_CreateReg0(mcInst,0x39);
      break;
    case EA_REG_CR8:
      MCOperand_CreateReg0(mcInst,0x3a);
      break;
    case EA_REG_CR9:
      MCOperand_CreateReg0(mcInst,0x3b);
      break;
    case EA_REG_CR10:
      MCOperand_CreateReg0(mcInst,0x3c);
      break;
    case EA_REG_CR11:
      MCOperand_CreateReg0(mcInst,0x3d);
      break;
    case EA_REG_CR12:
      MCOperand_CreateReg0(mcInst,0x3e);
      break;
    case EA_REG_CR13:
      MCOperand_CreateReg0(mcInst,0x3f);
      break;
    case EA_REG_CR14:
      MCOperand_CreateReg0(mcInst,0x40);
      break;
    case EA_REG_CR15:
      MCOperand_CreateReg0(mcInst,0x41);
      break;
    case EA_REG_RIP:
      MCOperand_CreateReg0(mcInst,0x29);
      break;
    default:
      return true;
    }
    return false;
  }
  return true;
}

Assistant:

static bool translateRMRegister(MCInst *mcInst, InternalInstruction *insn)
{
	if (insn->eaBase == EA_BASE_sib || insn->eaBase == EA_BASE_sib64) {
		//debug("A R/M register operand may not have a SIB byte");
		return true;
	}

	switch (insn->eaBase) {
		case EA_BASE_NONE:
			//debug("EA_BASE_NONE for ModR/M base");
			return true;
#define ENTRY(x) case EA_BASE_##x:
			ALL_EA_BASES
#undef ENTRY
				//debug("A R/M register operand may not have a base; "
				//      "the operand must be a register.");
				return true;
#define ENTRY(x)                                                      \
		case EA_REG_##x:                                                    \
			MCOperand_CreateReg0(mcInst, X86_##x); break;
			ALL_REGS
#undef ENTRY
		default:
				//debug("Unexpected EA base register");
				return true;
	}

	return false;
}